

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCodeAndObjectIDType __thiscall
PDFDocumentHandler::CopyObject(PDFDocumentHandler *this,ObjectIDType inSourceObjectID)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  EStatusCode EVar3;
  _List_node_base *p_Var4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  EStatusCodeAndObjectIDType EVar8;
  ObjectIDTypeList anObjectList;
  _List_node_base *local_40;
  _List_node_base local_38;
  long local_28;
  
  p_Var1 = &(this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0;
      p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < inSourceObjectID]) {
    if (*(ulong *)(p_Var7 + 1) >= inSourceObjectID) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var7 = p_Var6, inSourceObjectID < *(ulong *)(p_Var6 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_38._M_next = &local_38;
    local_28 = 0;
    local_40 = (_List_node_base *)inSourceObjectID;
    local_38._M_prev = local_38._M_next;
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = local_40;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    local_28 = local_28 + 1;
    EVar3 = WriteNewObjects(this,(ObjectIDTypeList *)&local_38);
    pmVar5 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->mSourceToTarget,(key_type *)&local_40);
    p_Var7 = (_Base_ptr)*pmVar5;
    p_Var4 = local_38._M_next;
    while (p_Var4 != &local_38) {
      p_Var2 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var4->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var4,0x18);
      p_Var4 = p_Var2;
    }
  }
  else {
    p_Var7 = p_Var7[1]._M_parent;
    EVar3 = eSuccess;
  }
  EVar8._4_4_ = 0;
  EVar8.first = EVar3;
  EVar8.second = (unsigned_long)p_Var7;
  return EVar8;
}

Assistant:

EStatusCodeAndObjectIDType PDFDocumentHandler::CopyObject(ObjectIDType inSourceObjectID)
{
	EStatusCodeAndObjectIDType result;

	ObjectIDTypeToObjectIDTypeMap::iterator it = mSourceToTarget.find(inSourceObjectID);
	if(it == mSourceToTarget.end())
	{
		ObjectIDTypeList anObjectList;
		anObjectList.push_back(inSourceObjectID);
		result.first = WriteNewObjects(anObjectList);
		result.second = mSourceToTarget[inSourceObjectID];
	}
	else
	{
		result.first = PDFHummus::eSuccess;
		result.second = it->second;
	}
	return result;
}